

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O3

bool __thiscall mocker::DominatorTree::isDominating(DominatorTree *this,size_t u,size_t v)

{
  const_iterator cVar1;
  const_iterator cVar2;
  size_t local_10;
  size_t local_8;
  
  local_10 = v;
  local_8 = u;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->dominating)._M_h,&local_8);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    cVar2 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)((long)cVar1.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_cur + 0x10),&local_10);
    return cVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

bool DominatorTree::isDominating(std::size_t u, std::size_t v) const {
  return isIn(dominating.at(u), v);
}